

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_combo_begin_image(nk_context *ctx,nk_image img,nk_vec2 size)

{
  nk_command_buffer *b;
  float fVar1;
  float fVar2;
  float fVar3;
  nk_window *win;
  nk_rect r;
  nk_rect rect;
  nk_rect header;
  nk_rect r_00;
  nk_widget_layout_states nVar4;
  int iVar5;
  long lVar6;
  nk_context *i;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar7;
  nk_rect r_01;
  nk_rect rect_00;
  nk_rect bounds;
  nk_rect content;
  nk_rect local_a0;
  uint local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  nk_rect local_58;
  nk_rect local_40;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x6092,
                  "int nk_combo_begin_image(struct nk_context *, struct nk_image, struct nk_vec2)");
  }
  win = ctx->current;
  if (win != (nk_window *)0x0) {
    local_68._8_4_ = in_XMM0_Dc;
    local_68._0_8_ = size;
    local_68._12_4_ = in_XMM0_Dd;
    if (win->layout != (nk_panel *)0x0) {
      nVar4 = nk_widget(&local_a0,ctx);
      if (nVar4 == NK_WIDGET_INVALID) {
        iVar5 = 0;
      }
      else {
        i = ctx;
        if ((win->layout->flags & 0x1000) != 0) {
          i = (nk_context *)0x0;
        }
        if (nVar4 == NK_WIDGET_ROM) {
          i = (nk_context *)0x0;
        }
        local_78 = CONCAT44(local_a0.y,local_a0.x);
        local_88 = CONCAT44(local_a0.h,local_a0.w);
        r.y = local_a0.y;
        r.x = local_a0.x;
        r.w = local_a0.w;
        r.h = local_a0.h;
        uStack_70 = 0;
        uStack_80 = 0;
        iVar5 = nk_button_behavior(&ctx->last_widget_state,r,&i->input,NK_BUTTON_DEFAULT);
        lVar6 = 0x1af0;
        if ((ctx->last_widget_state & 0x20) == 0) {
          lVar6 = (ulong)(ctx->last_widget_state & 0x10) * 2 + 0x1ab0;
        }
        b = &win->buffer;
        local_8c = (uint)(iVar5 != 0);
        if (*(int *)((long)&(ctx->input).keyboard.keys[0].down + lVar6) == 1) {
          r_01.w = (float)(nk_symbol_type)local_88;
          r_01.h = (float)local_88._4_4_;
          r_01.x = (float)(undefined4)local_78;
          r_01.y = (float)local_78._4_4_;
          nk_draw_image(b,r_01,(nk_image *)((long)&(ctx->input).keyboard.keys[1].down + lVar6),
                        (nk_color)0xffffffff);
        }
        else {
          rect_00.w = (float)(nk_symbol_type)local_88;
          rect_00.h = (float)local_88._4_4_;
          rect_00.x = (float)(undefined4)local_78;
          rect_00.y = (float)local_78._4_4_;
          nk_fill_rect(b,rect_00,(ctx->style).combo.rounding,
                       *(nk_color *)((long)&(ctx->input).keyboard.keys[1].down + lVar6));
          rect.y = local_a0.y;
          rect.x = local_a0.x;
          rect.w = local_a0.w;
          rect.h = local_a0.h;
          nk_stroke_rect(b,rect,(ctx->style).combo.rounding,(ctx->style).combo.border,
                         (ctx->style).combo.border_color);
        }
        lVar6 = 0x1be4;
        if ((ctx->last_widget_state & 0x10) == 0) {
          lVar6 = (ulong)(iVar5 != 0) * 8 + 0x1be0;
        }
        local_88 = CONCAT44(local_88._4_4_,
                            *(undefined4 *)((long)&(ctx->input).keyboard.keys[0].down + lVar6));
        fVar1 = (ctx->style).combo.button.padding.x;
        fVar2 = (ctx->style).combo.button_padding.y;
        local_40.h = local_a0.h - (fVar2 + fVar2);
        fVar7 = ((local_a0.w + local_a0.x) - local_a0.h) - fVar2;
        local_40.x = fVar1 + fVar7;
        fVar3 = (ctx->style).combo.button.padding.y;
        local_40.y = fVar2 + local_a0.y + fVar3;
        local_40.w = local_40.h - (fVar1 + fVar1);
        local_40.h = local_40.h - (fVar3 + fVar3);
        fVar1 = (ctx->style).combo.content_padding.y;
        local_58.y = local_a0.y + fVar1;
        local_58.h = local_a0.h - (fVar1 + fVar1);
        local_58.x = local_a0.x + (ctx->style).combo.content_padding.x;
        local_58.w = (fVar7 - fVar1) - local_58.x;
        r_00.y = local_58.y;
        r_00.x = local_58.x;
        r_00.w = local_58.w;
        r_00.h = local_58.h;
        nk_draw_image(b,r_00,&img,(nk_color)0xffffffff);
        nk_draw_button_symbol
                  (b,&local_58,&local_40,ctx->last_widget_state,&(ctx->style).combo.button,
                   (nk_symbol_type)local_88,(ctx->style).font);
        header.y = local_a0.y;
        header.x = local_a0.x;
        header.w = local_a0.w;
        header.h = local_a0.h;
        iVar5 = nk_combo_begin(ctx,win,(nk_vec2)local_68._0_8_,local_8c,header);
      }
      return iVar5;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x6094,
                  "int nk_combo_begin_image(struct nk_context *, struct nk_image, struct nk_vec2)");
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x6093,
                "int nk_combo_begin_image(struct nk_context *, struct nk_image, struct nk_vec2)");
}

Assistant:

NK_API int
nk_combo_begin_image(struct nk_context *ctx, struct nk_image img, struct nk_vec2 size)
{
    struct nk_window *win;
    struct nk_style *style;
    const struct nk_input *in;

    struct nk_rect header;
    int is_clicked = nk_false;
    enum nk_widget_layout_states s;
    const struct nk_style_item *background;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    s = nk_widget(&header, ctx);
    if (s == NK_WIDGET_INVALID)
        return 0;

    in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
    if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
        is_clicked = nk_true;

    /* draw combo box header background and border */
    if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED)
        background = &style->combo.active;
    else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
        background = &style->combo.hover;
    else background = &style->combo.normal;

    if (background->type == NK_STYLE_ITEM_IMAGE) {
        nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
    } else {
        nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
        nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
    }
    {
        struct nk_rect bounds = {0,0,0,0};
        struct nk_rect content;
        struct nk_rect button;

        enum nk_symbol_type sym;
        if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
            sym = style->combo.sym_hover;
        else if (is_clicked)
            sym = style->combo.sym_active;
        else sym = style->combo.sym_normal;

        /* calculate button */
        button.w = header.h - 2 * style->combo.button_padding.y;
        button.x = (header.x + header.w - header.h) - style->combo.button_padding.y;
        button.y = header.y + style->combo.button_padding.y;
        button.h = button.w;

        content.x = button.x + style->combo.button.padding.x;
        content.y = button.y + style->combo.button.padding.y;
        content.w = button.w - 2 * style->combo.button.padding.x;
        content.h = button.h - 2 * style->combo.button.padding.y;

        /* draw image */
        bounds.h = header.h - 2 * style->combo.content_padding.y;
        bounds.y = header.y + style->combo.content_padding.y;
        bounds.x = header.x + style->combo.content_padding.x;
        bounds.w = (button.x - style->combo.content_padding.y) - bounds.x;
        nk_draw_image(&win->buffer, bounds, &img, nk_white);

        /* draw open/close button */
        nk_draw_button_symbol(&win->buffer, &bounds, &content, ctx->last_widget_state,
            &ctx->style.combo.button, sym, style->font);
    }
    return nk_combo_begin(ctx, win, size, is_clicked, header);
}